

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.cpp
# Opt level: O0

void ggml_vec_silu_f32(int n,float *y,float *x)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int i;
  undefined1 in_stack_00000038 [64];
  int local_e4;
  
  for (local_e4 = 0; local_e4 + 0xf < in_EDI; local_e4 = local_e4 + 0x10) {
    puVar1 = (undefined8 *)(in_RSI + (long)local_e4 * 4);
    puVar2 = (undefined8 *)(in_RDX + (long)local_e4 * 4);
    uVar4 = *puVar2;
    uVar5 = puVar2[1];
    uVar6 = puVar2[2];
    uVar7 = puVar2[3];
    uVar8 = puVar2[4];
    uVar9 = puVar2[5];
    uVar10 = puVar2[6];
    uVar11 = puVar2[7];
    ggml_v_silu((__m512)in_stack_00000038);
    *puVar1 = uVar4;
    puVar1[1] = uVar5;
    puVar1[2] = uVar6;
    puVar1[3] = uVar7;
    puVar1[4] = uVar8;
    puVar1[5] = uVar9;
    puVar1[6] = uVar10;
    puVar1[7] = uVar11;
  }
  for (; local_e4 < in_EDI; local_e4 = local_e4 + 1) {
    fVar3 = ggml_silu_f32(0.0);
    *(float *)(in_RSI + (long)local_e4 * 4) = fVar3;
  }
  return;
}

Assistant:

void ggml_vec_silu_f32(const int n, float * y, const float * x) {
    int i = 0;
#if defined(__AVX512F__) && defined(__AVX512DQ__)
    for (; i + 15 < n; i += 16) {
        _mm512_storeu_ps(y + i, ggml_v_silu(_mm512_loadu_ps(x + i)));
    }
#elif defined(__AVX2__) && defined(__FMA__)
    for (; i + 7 < n; i += 8) {
        _mm256_storeu_ps(y + i, ggml_v_silu(_mm256_loadu_ps(x + i)));
    }
#elif defined(__SSE2__)
    for (; i + 3 < n; i += 4) {
        _mm_storeu_ps(y + i, ggml_v_silu(_mm_loadu_ps(x + i)));
    }
#elif defined(__ARM_NEON) && defined(__aarch64__)
    for (; i + 3 < n; i += 4) {
        vst1q_f32(y + i, ggml_v_silu(vld1q_f32(x + i)));
    }
#endif
    for (; i < n; ++i) {
        y[i] = ggml_silu_f32(x[i]);
    }
}